

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

void __thiscall helics::FilterFederate::processFilterReturn(FilterFederate *this,ActionMessage *cmd)

{
  atomic<int> *paVar1;
  uint32_t pid;
  uint32_t pid_00;
  GlobalFederateId fid;
  InterfaceHandle IVar2;
  BasicHandleInfo *pBVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  FilterCoordinator *pFVar6;
  pointer ppFVar7;
  _Base_ptr p_Var8;
  pointer ppFVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  pair<helics::ActionMessage_&,_bool> pVar12;
  BaseType fid_index;
  key_type local_34;
  
  pBVar3 = HandleManager::getInterfaceHandle
                     (this->mHandles,(InterfaceHandle)(cmd->dest_handle).hid,ENDPOINT);
  if (pBVar3 != (BasicHandleInfo *)0x0) {
    pid_00 = cmd->sequenceID;
    fid.gid = (pBVar3->handle).fed_id.gid;
    pmVar4 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&local_34);
    p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var8 = p_Var10;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        if ((int)pid_00 <= (int)p_Var5[1]._M_color) {
          p_Var8 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)pid_00];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((p_Var8 != p_Var10) && ((int)p_Var8[1]._M_color <= (int)pid_00)) {
        p_Var10 = p_Var8;
      }
    }
    pmVar4 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&local_34);
    if ((_Rb_tree_header *)p_Var10 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
      if (cmd->messageAction == cmd_null_message) {
LAB_00356b48:
        acceptProcessReturn(this,fid,pid_00);
      }
      else {
        pFVar6 = getFilterCoordinator(this,(InterfaceHandle)(pBVar3->handle).handle.hid);
        ActionMessage::setAction(cmd,cmd_send_message);
        uVar11 = (ulong)cmd->counter;
        ppFVar7 = (pFVar6->sourceFilters).
                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppFVar9 = (pFVar6->sourceFilters).
                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        while (uVar11 = uVar11 + 1, uVar11 < (ulong)((long)ppFVar9 - (long)ppFVar7 >> 3)) {
          if ((ppFVar7[uVar11]->flags & 0x1000) == 0) {
            pVar12 = executeFilter(this,cmd,ppFVar7[uVar11]);
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              if (cmd->messageAction == cmd_ignore) goto LAB_00356b48;
              if (uVar11 < ((long)(pFVar6->sourceFilters).
                                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pFVar6->sourceFilters).
                                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                cmd->counter = (uint16_t)uVar11;
                ActionMessage::setAction(cmd,cmd_send_for_filter_return);
                LOCK();
                paVar1 = &this->messageCounter;
                pid = (paVar1->super___atomic_base<int>)._M_i;
                (paVar1->super___atomic_base<int>)._M_i =
                     (paVar1->super___atomic_base<int>)._M_i + 1;
                UNLOCK();
                cmd->sequenceID = pid;
                IVar2.hid = (pBVar3->handle).handle.hid;
                cmd->source_id = (GlobalFederateId)(pBVar3->handle).fed_id.gid;
                cmd->source_handle = (InterfaceHandle)IVar2.hid;
                generateProcessMarker
                          (this,(GlobalFederateId)(pBVar3->handle).fed_id.gid,pid,
                           (Time)(cmd->actionTime).internalTimeCode);
              }
              else {
                ActionMessage::setAction(cmd,cmd_send_for_filter);
              }
              break;
            }
            ppFVar7 = (pFVar6->sourceFilters).
                      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppFVar9 = (pFVar6->sourceFilters).
                      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        acceptProcessReturn(this,fid,pid_00);
        if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,cmd);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterReturn(ActionMessage& cmd)
{
    auto* handle = mHandles->getInterfaceHandle(cmd.dest_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return;
    }

    auto mid = cmd.sequenceID;
    auto fid = handle->getFederateId();
    auto fid_index = fid.baseValue();

    if (ongoingFilterProcesses[fid_index].find(mid) != ongoingFilterProcesses[fid_index].end()) {
        if (cmd.action() == CMD_NULL_MESSAGE) {
            acceptProcessReturn(fid, mid);
            return;
        }
        auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
        cmd.setAction(CMD_SEND_MESSAGE);
        bool needToSendMessage{true};
        for (auto ii = static_cast<size_t>(cmd.counter) + 1; ii < filtFunc->sourceFilters.size();
             ++ii) {
            auto* filt = filtFunc->sourceFilters[ii];
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }

            auto press = executeFilter(cmd, filt);
            if (!press.second) {
                if (cmd.action() == CMD_IGNORE) {
                    needToSendMessage = false;
                    break;
                }

                if (ii < filtFunc->sourceFilters.size() - 1) {
                    cmd.counter = static_cast<uint16_t>(ii);
                    cmd.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    cmd.sequenceID = messageCounter++;
                    cmd.setSource(handle->handle);
                    generateProcessMarker(handle->getFederateId(), cmd.sequenceID, cmd.actionTime);
                } else {
                    cmd.setAction(CMD_SEND_FOR_FILTER);
                }
                break;
            }
        }
        acceptProcessReturn(fid, mid);
        if (needToSendMessage) {
            mDeliverMessage(cmd);
        }
    }
}